

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# current_allocated_bytes_test.cc
# Opt level: O3

void __thiscall
CurrentAllocatedBytes_Basic_Test::~CurrentAllocatedBytes_Basic_Test
          (CurrentAllocatedBytes_Basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CurrentAllocatedBytes, Basic) {
  static constexpr char kCurrent[] = "generic.current_allocated_bytes";

  size_t before_bytes, after_bytes;
  ASSERT_TRUE(MallocExtension::instance()->GetNumericProperty(kCurrent, &before_bytes));
  (::operator delete)((::operator new)(200));
  ASSERT_TRUE(MallocExtension::instance()->GetNumericProperty(kCurrent, &after_bytes));

  ASSERT_EQ(before_bytes, after_bytes);
}